

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

uint Extra_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm,short *pStore)

{
  ushort *puVar1;
  ulong *puVar2;
  short sVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint *pIn;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar4 = 1 << ((byte)nVars - 5 & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  uVar10 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    iVar7 = 0;
  }
  else {
    lVar9 = uVar10 + 1;
    iVar7 = 0;
    do {
      uVar6 = (pInOut[lVar9 + -2] >> 1 & 0x55555555) + (pInOut[lVar9 + -2] & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
      uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
      iVar7 = (uVar6 >> 0x10) + iVar7 + (uVar6 & 0xffff);
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  iVar8 = uVar4 * 0x10;
  if (((iVar7 != iVar8 && SBORROW4(iVar7,iVar8) == (int)(iVar7 + uVar4 * -0x10) < 0) ||
      ((uVar6 = 0, iVar7 == iVar8 && ((*pInOut & 1) != 0)))) &&
     (uVar6 = 1 << ((byte)nVars & 0x1f), 0 < (int)uVar4)) {
    lVar9 = uVar10 + 1;
    do {
      pInOut[lVar9 + -2] = ~pInOut[lVar9 + -2];
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  Extra_TruthCountOnesInCofs(pInOut,nVars,pStore);
  if (0 < nVars) {
    uVar11 = 0;
    do {
      sVar3 = pStore[uVar11 * 2];
      if (pStore[uVar11 * 2 + 1] < sVar3) {
        uVar6 = uVar6 | 1 << ((uint)uVar11 & 0x1f);
        pStore[uVar11 * 2] = pStore[uVar11 * 2 + 1];
        pStore[uVar11 * 2 + 1] = sVar3;
        Extra_TruthChangePhase(pInOut,nVars,(uint)uVar11);
      }
      uVar11 = uVar11 + 1;
    } while ((uint)nVars != uVar11);
  }
  bVar12 = false;
  do {
    bVar5 = true;
    if (1 < nVars) {
      uVar11 = 0;
      bVar5 = false;
      pIn = pInOut;
      do {
        pInOut = pIn;
        if (pStore[uVar11 * 2 + 2] < pStore[uVar11 * 2]) {
          puVar1 = (ushort *)(pCanonPerm + uVar11);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          bVar12 = (bool)(bVar12 ^ 1);
          puVar2 = (ulong *)(pStore + uVar11 * 2);
          *puVar2 = *puVar2 << 0x20 | *puVar2 >> 0x20;
          Extra_TruthSwapAdjacentVars(pAux,pIn,nVars,(int)uVar11);
          bVar5 = true;
          pInOut = pAux;
          pAux = pIn;
        }
        uVar11 = uVar11 + 1;
        pIn = pInOut;
      } while (nVars - 1 != uVar11);
      bVar5 = !bVar5;
    }
  } while (!bVar5);
  if ((0 < (int)uVar4) && (bVar12)) {
    lVar9 = uVar10 + 1;
    do {
      pAux[lVar9 + -2] = pInOut[lVar9 + -2];
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  return uVar6;
}

Assistant:

unsigned Extra_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm, short * pStore )
{
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Extra_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    nOnes = Extra_TruthCountOnes(pIn, nVars);
    if ( (nOnes > nWords * 16) || ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Extra_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Extra_TruthCountOnesInCofs( pIn, nVars, pStore );

    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Extra_TruthChangePhase( pIn, nVars, i );
    }

//    Extra_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Extra_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Extra_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Extra_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Extra_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Extra_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}